

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

uint8_t * google::protobuf::internal::SerializeInternalToArray
                    (uint8_t *base,FieldMetadata *field_metadata_table,int32_t num_fields,
                    bool is_deterministic,uint8_t *buffer)

{
  FieldMetadata *md;
  bool bVar1;
  int iVar2;
  uint8_t *field;
  undefined1 local_d0 [8];
  CodedOutputStream output_stream;
  ArrayOutputStream array_stream;
  uint8_t *ptr;
  FieldMetadata *field_metadata;
  int i;
  SpecialSerializer func;
  ArrayOutput *output;
  ArrayOutput array_output;
  uint8_t *buffer_local;
  bool is_deterministic_local;
  int32_t num_fields_local;
  FieldMetadata *field_metadata_table_local;
  uint8_t *base_local;
  
  output = (ArrayOutput *)buffer;
  array_output.ptr._0_1_ = is_deterministic;
  array_output._8_8_ = buffer;
  for (field_metadata._4_4_ = 0; field_metadata._4_4_ < num_fields;
      field_metadata._4_4_ = field_metadata._4_4_ + 1) {
    md = field_metadata_table + field_metadata._4_4_;
    field = base + md->offset;
    switch(md->type) {
    case 0:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 1:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 2:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 3:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 4:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 5:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 6:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 7:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 8:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 9:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 10:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0xb:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0xc:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0xd:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0xe:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0xf:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x10:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x11:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    default:
      SerializeNotImplemented(md->type);
      break;
    case 0x14:
      bVar1 = IsPresent(base,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x15:
      bVar1 = IsNull<1>(field);
      if (!bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x16:
      bVar1 = IsNull<2>(field);
      if (!bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x17:
      bVar1 = IsNull<3>(field);
      if (!bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x18:
      bVar1 = IsNull<4>(field);
      if (!bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x19:
      bVar1 = IsNull<5>(field);
      if (!bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x1a:
      bVar1 = IsNull<6>(field);
      if (!bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x1b:
      bVar1 = IsNull<7>(field);
      if (!bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x1c:
      bVar1 = IsNull<8>(field);
      if (!bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x1d:
      bVar1 = IsNull<9>(field);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x1e:
      bVar1 = IsNull<10>(field);
      if (!bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x1f:
      bVar1 = IsNull<11>(field);
      if (!bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x20:
      bVar1 = IsNull<12>(field);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x21:
      bVar1 = IsNull<13>(field);
      if (!bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x22:
      bVar1 = IsNull<14>(field);
      if (!bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x23:
      bVar1 = IsNull<15>(field);
      if (!bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x24:
      bVar1 = IsNull<16>(field);
      if (!bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x25:
      bVar1 = IsNull<17>(field);
      if (!bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x26:
      bVar1 = IsNull<18>(field);
      if (!bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x29:
      bVar1 = IsNull<21>(field);
      if (!bVar1) {
        SingularFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x2a:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x2b:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x2c:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x2d:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x2e:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x2f:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x30:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x31:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x32:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x33:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x34:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x35:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x36:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x37:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x38:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x39:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x3a:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x3b:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x3e:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x3f:
      PackedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x40:
      PackedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x41:
      PackedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x42:
      PackedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x43:
      PackedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x44:
      PackedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x45:
      PackedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x46:
      PackedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x47:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x48:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x49:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x4a:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x4b:
      PackedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x4c:
      PackedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x4d:
      PackedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x4e:
      PackedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x4f:
      PackedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x50:
      PackedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x53:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (field,md,(ArrayOutput *)&output);
      break;
    case 0x54:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x55:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x56:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x57:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x58:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x59:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x5a:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x5b:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x5c:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x5d:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x5e:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x5f:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<12>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x60:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x61:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x62:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 99:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 100:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x65:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x68:
      bVar1 = IsOneofPresent(base,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,(ArrayOutput *)&output);
      }
      break;
    case 0x69:
      io::ArrayOutputStream::ArrayOutputStream
                ((ArrayOutputStream *)&output_stream.start_count_,output,0x7fffffff,-1);
      io::CodedOutputStream::CodedOutputStream
                ((CodedOutputStream *)local_d0,(ZeroCopyOutputStream *)&output_stream.start_count_);
      io::CodedOutputStream::SetSerializationDeterministic
                ((CodedOutputStream *)local_d0,is_deterministic);
      (*(code *)md->ptr)(base,md->offset,md->tag,md->has_offset,local_d0);
      iVar2 = io::CodedOutputStream::ByteCount((CodedOutputStream *)local_d0);
      output = (ArrayOutput *)((long)&output->ptr + (long)iVar2);
      io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_d0);
      io::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&output_stream.start_count_);
    }
  }
  return (uint8_t *)output;
}

Assistant:

uint8_t* SerializeInternalToArray(const uint8_t* base,
                                  const FieldMetadata* field_metadata_table,
                                  int32_t num_fields, bool is_deterministic,
                                  uint8_t* buffer) {
  ArrayOutput array_output = {buffer, is_deterministic};
  ArrayOutput* output = &array_output;
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8_t* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);
      // Special cases
      case FieldMetadata::kSpecial: {
        io::ArrayOutputStream array_stream(array_output.ptr, INT_MAX);
        io::CodedOutputStream output_stream(&array_stream);
        output_stream.SetSerializationDeterministic(is_deterministic);
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, &output_stream);
        array_output.ptr += output_stream.ByteCount();
      } break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
  return array_output.ptr;
}